

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall NLProblemBuilderTest_OnCall_Test::TestBody(NLProblemBuilderTest_OnCall_Test *this)

{
  MockProblemBuilder *this_00;
  MockSpec<TestFunction_(int)> *this_01;
  TypedExpectation<TestFunction_(int)> *this_02;
  MockSpec<TestCallExprBuilder_(TestFunction,_int)> *this_03;
  TypedExpectation<TestCallExprBuilder_(TestFunction,_int)> *this_04;
  MockSpec<BasicTestExpr<1>_(TestCallExprBuilder)> *this_05;
  TypedExpectation<BasicTestExpr<1>_(TestCallExprBuilder)> *this_06;
  NLProblemBuilder<MockProblemBuilder> *this_07;
  MatcherBase<int> MStack_68;
  MatcherBase<int> local_50;
  linked_ptr<testing::ActionInterface<TestCallExprBuilder_(TestFunction,_int)>_> local_38;
  undefined4 local_24;
  
  this_00 = &(this->super_NLProblemBuilderTest).builder.super_MockProblemBuilder;
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_50,0x2a);
  this_01 = MockProblemBuilder::gmock_function(this_00,(Matcher<int> *)&local_50);
  this_02 = testing::internal::MockSpec<TestFunction_(int)>::InternalExpectedAt
                      (this_01,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x7bc,"builder","function(42)");
  local_38.value_._0_4_ = 0x2a;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&MStack_68);
  testing::internal::TypedExpectation<TestFunction_(int)>::WillOnce
            (this_02,(Action<TestFunction_(int)> *)&MStack_68);
  testing::internal::linked_ptr<testing::ActionInterface<TestFunction_(int)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<TestFunction_(int)>_> *)&MStack_68);
  testing::internal::MatcherBase<int>::~MatcherBase(&local_50);
  testing::Matcher<TestFunction>::Matcher((Matcher<TestFunction> *)&local_50,(TestFunction)0x2a);
  testing::Matcher<int>::Matcher((Matcher<int> *)&MStack_68,0xb);
  this_03 = MockProblemBuilder::gmock_BeginCall
                      (this_00,(Matcher<TestFunction> *)&local_50,(Matcher<int> *)&MStack_68);
  this_04 = testing::internal::MockSpec<TestCallExprBuilder_(TestFunction,_int)>::InternalExpectedAt
                      (this_03,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x7bd,"builder","BeginCall(func, 11)");
  local_24 = 0x2a;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_38);
  testing::internal::TypedExpectation<TestCallExprBuilder_(TestFunction,_int)>::WillOnce
            (this_04,(Action<TestCallExprBuilder_(TestFunction,_int)> *)&local_38);
  testing::internal::linked_ptr<testing::ActionInterface<TestCallExprBuilder_(TestFunction,_int)>_>
  ::~linked_ptr(&local_38);
  testing::internal::MatcherBase<int>::~MatcherBase(&MStack_68);
  testing::internal::MatcherBase<TestFunction>::~MatcherBase((MatcherBase<TestFunction> *)&local_50)
  ;
  this_07 = &(this->super_NLProblemBuilderTest).adapter;
  mp::internal::NLProblemBuilder<MockProblemBuilder>::BeginCall(this_07,0x2a,0xb);
  testing::Matcher<TestCallExprBuilder>::Matcher
            ((Matcher<TestCallExprBuilder> *)&local_50,(TestCallExprBuilder)0x2a);
  this_05 = MockProblemBuilder::gmock_EndCall(this_00,(Matcher<TestCallExprBuilder> *)&local_50);
  this_06 = testing::internal::MockSpec<BasicTestExpr<1>_(TestCallExprBuilder)>::InternalExpectedAt
                      (this_05,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x7bf,"builder","EndCall(call_builder)");
  local_38.value_._0_4_ = 0x2a;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&MStack_68);
  testing::internal::TypedExpectation<BasicTestExpr<1>_(TestCallExprBuilder)>::WillOnce
            (this_06,(Action<BasicTestExpr<1>_(TestCallExprBuilder)> *)&MStack_68);
  testing::internal::linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestCallExprBuilder)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestCallExprBuilder)>_> *)
              &MStack_68);
  testing::internal::MatcherBase<TestCallExprBuilder>::~MatcherBase
            ((MatcherBase<TestCallExprBuilder> *)&local_50);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::EndCall(this_07,(CallArgHandler)0x2a);
  return;
}

Assistant:

TEST_F(NLProblemBuilderTest, OnCall) {
  auto func = TestFunction(ID);
  auto call_builder = TestCallExprBuilder(ID);
  EXPECT_CALL(builder, function(42)).WillOnce(Return(func));
  EXPECT_CALL(builder, BeginCall(func, 11)).WillOnce(Return(call_builder));
  adapter.BeginCall(42, 11);
  EXPECT_CALL(builder, EndCall(call_builder)).
      WillOnce(Return(TestNumericExpr(ID)));
  adapter.EndCall(call_builder);
}